

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

BatchnormLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BatchnormLayerParams>
          (Arena *arena)

{
  BatchnormLayerParams *this;
  
  if (arena == (Arena *)0x0) {
    this = (BatchnormLayerParams *)operator_new(0x48);
    CoreML::Specification::BatchnormLayerParams::BatchnormLayerParams(this,(Arena *)0x0,false);
  }
  else {
    this = (BatchnormLayerParams *)
           AllocateAlignedWithHook
                     (arena,0x48,(type_info *)&CoreML::Specification::BatchnormLayerParams::typeinfo
                     );
    CoreML::Specification::BatchnormLayerParams::BatchnormLayerParams(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }